

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid_Iterator.h
# Opt level: O3

void __thiscall Nova::Grid_Iterator<float,_2>::Next_Helper(Grid_Iterator<float,_2> *this)

{
  int iVar1;
  undefined8 uVar2;
  int iVar3;
  ulong uVar4;
  undefined8 uVar5;
  
  iVar1 = (this->index)._data._M_elems[0];
  (this->index)._data._M_elems[1] = (this->region).min_corner._data._M_elems[1];
  if (iVar1 < (this->region).max_corner._data._M_elems[0]) {
    (this->index)._data._M_elems[0] = iVar1 + 1;
    return;
  }
  iVar1 = this->number_of_regions;
  (this->index)._data._M_elems[0] = (this->region).min_corner._data._M_elems[0];
  uVar4 = (ulong)this->current_region;
  iVar3 = this->current_region + 1;
  this->valid = iVar3 < iVar1;
  if (iVar3 < iVar1) {
    this->current_region = iVar3;
    if ((uVar4 & 0xfffffffffffffff) == 0xffffffffffffffe) {
      uVar5 = *(undefined8 *)(this->region).min_corner._data._M_elems;
    }
    else {
      uVar5 = *(undefined8 *)this->regions[uVar4 + 1].min_corner._data._M_elems;
      uVar2 = *(undefined8 *)this->regions[uVar4 + 1].max_corner._data._M_elems;
      *(undefined8 *)(this->region).min_corner._data._M_elems =
           *(undefined8 *)this->regions[uVar4 + 1].min_corner._data._M_elems;
      *(undefined8 *)(this->region).max_corner._data._M_elems = uVar2;
    }
    *(undefined8 *)(this->index)._data._M_elems = uVar5;
  }
  return;
}

Assistant:

void Next_Helper()
    {
        index(d-1)=region.min_corner(d-1);
        for(int i=d-2;i>=0;--i)
        {
            if(index(i)<region.max_corner(i)){++index(i);return;}
            index(i)=region.min_corner(i);
        }
        Reset(current_region+1);
    }